

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O0

TProb Cipher::calcScore0(TParameters *params,TFreqMap *freqMap,TClusters *txt,
                        TClusterToLetterMap *clMap)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  key_type_conflict *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  int *in_RSI;
  long in_RDI;
  float fVar8;
  double dVar9;
  value_type c_1;
  value_type c;
  TProb res;
  TCode mask;
  TCode curc;
  int k;
  int i1;
  float curf;
  int i_1;
  array<float,_27UL> *freq;
  float letFreqCost;
  int i;
  vector<int,_std::allocator<int>_> plain;
  array<int,_27UL> letCount;
  int nlet;
  vector<double,_std::allocator<double>_> *prob;
  TGramLen *len;
  int n;
  size_type in_stack_fffffffffffffe98;
  array<float,_27UL> *in_stack_fffffffffffffea0;
  value_type_conflict2 *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  mapped_type in_stack_fffffffffffffeb4;
  size_type in_stack_fffffffffffffeb8;
  key_type_conflict *__k;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffec0;
  double local_118;
  uint local_10c;
  int local_108;
  int local_104;
  int local_fc;
  float local_ec;
  int local_e8;
  vector<int,_std::allocator<int>_> local_d0;
  undefined4 local_b4;
  int local_44;
  vector<double,_std::allocator<double>_> *local_40;
  int *local_38;
  int local_2c;
  key_type_conflict *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  int *local_18;
  long local_10;
  double local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  local_2c = (int)sVar3;
  local_38 = local_18;
  local_40 = (vector<double,_std::allocator<double>_> *)(local_18 + 6);
  local_44 = 0;
  local_b4 = 0;
  std::array<int,_27UL>::fill
            ((array<int,_27UL> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8);
  std::allocator<int>::allocator((allocator<int> *)0x1a8999);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::allocator<int>::~allocator((allocator<int> *)0x1a89bf);
  for (local_e8 = 0; local_e8 < local_2c; local_e8 = local_e8 + 1) {
    __k = local_28;
    std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_e8);
    in_stack_fffffffffffffec0 =
         (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                   (in_stack_fffffffffffffec0,__k);
    in_stack_fffffffffffffeb4 = *(mapped_type *)&(in_stack_fffffffffffffec0->_M_t)._M_impl;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_e8);
    *pvVar4 = in_stack_fffffffffffffeb4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_e8);
    if ((*pvVar4 < 1) ||
       (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_e8),
       0x1a < *pvVar4)) {
      if ((*(byte *)(local_10 + 0x30) & 1) != 0) {
        pvVar5 = std::array<int,_27UL>::operator[]
                           ((array<int,_27UL> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
        ;
        *pvVar5 = *pvVar5 + 1;
        local_44 = local_44 + 1;
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_e8);
      pvVar5 = std::array<int,_27UL>::operator[]
                         ((array<int,_27UL> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      *pvVar5 = *pvVar5 + 1;
      local_44 = local_44 + 1;
    }
  }
  local_ec = 0.0;
  for (local_fc = 0; local_fc < 0x1b; local_fc = local_fc + 1) {
    pvVar6 = std::array<float,_27UL>::operator[]
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    in_stack_fffffffffffffea0 = (array<float,_27UL> *)(double)*pvVar6;
    pvVar5 = std::array<int,_27UL>::operator[]
                       ((array<int,_27UL> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    fVar8 = (float)((double)in_stack_fffffffffffffea0 * 0.01 +
                   -(double)((float)*pvVar5 / (float)local_44));
    local_ec = fVar8 * fVar8 + local_ec;
  }
  dVar9 = sqrt((double)(local_ec / 27.0));
  local_104 = 0;
  local_108 = *local_38;
  local_10c = 0;
  iVar1 = *local_38;
  local_118 = 0.0;
  while( true ) {
    if (local_108 < 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_40,(long)(int)local_10c);
      local_118 = *pvVar7 + local_118;
      do {
        while( true ) {
          if (local_2c <= local_104) {
            local_8 = local_118 / (double)local_2c -
                      (double)(*(float *)(local_10 + 0x34) * (float)dVar9);
            goto LAB_001a8e89;
          }
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_104);
          iVar2 = *pvVar4;
          if ((0 < iVar2) && (iVar2 < 0x1b)) break;
          local_118 = *(double *)(local_10 + 0x20) + local_118;
          local_104 = local_104 + 1;
        }
        local_10c = iVar2 + ((1 << (((char)iVar1 + -1) * '\x05' & 0x1fU)) - 1U & local_10c) * 0x20;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_40,(long)(int)local_10c);
        local_118 = *pvVar7 + local_118;
        local_104 = local_104 + 1;
      } while( true );
    }
    if (local_2c <= local_104) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)local_104);
    iVar2 = *pvVar4;
    if ((iVar2 < 1) || (0x1a < iVar2)) {
      local_118 = *(double *)(local_10 + 0x20) + local_118;
      local_104 = local_104 + 1;
    }
    else {
      local_10c = iVar2 + local_10c * 0x20;
      local_108 = local_108 + -1;
      local_104 = local_104 + 1;
    }
  }
  local_8 = -1e+100;
LAB_001a8e89:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return local_8;
}

Assistant:

TProb calcScore0(const TParameters & params, const TFreqMap & freqMap, const TClusters & txt, const TClusterToLetterMap & clMap) {
        const int n = txt.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 27> letCount;
        letCount.fill(0);
        std::vector<TLetter> plain(n);
        for (int i = 0; i < n; ++i) {
            plain[i] = clMap.at(txt[i]);
            if (plain[i] > 0 && plain[i] <= 26) {
                ++letCount[plain[i]];
                ++nlet;
            } else if (params.includeSpaces) {
                ++letCount[0];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = params.includeSpaces ? kEnglishLetterWithSpacesFreq : kEnglishLetterFreq;
            for (int i = 0; i < 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 27.0;
        letFreqCost = sqrt(letFreqCost);
        //printf("letFreqCost = %g\n", letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        TProb res = 0.0;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            if (c > 0 && c <= 26) {
                curc <<= 5;
                curc += c;
                --k;
            } else {
                res += params.pNonAlphabetic;
            }
        }

        res += prob[curc];
        while (true) {
            curc &= mask;

            while (true) {
                if (i1 >= n) return res/n - params.wEnglishFreq*letFreqCost;
                auto c = plain[i1++];
                if (c > 0 && c <= 26) {
                    curc <<= 5;
                    curc += c;
                    break;
                } else {
                    res += params.pNonAlphabetic;
                }
            }

            res += prob[curc];
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }